

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbrImage.c
# Opt level: O3

Bbr_ImageTree_t *
Bbr_bddImageStart(DdManager *dd,DdNode *bCare,int nParts,DdNode **pbParts,int nVars,DdNode **pbVars,
                 int nBddMax,int fVerbose)

{
  size_t __size;
  DdHalfWord DVar1;
  void *pvVar2;
  int *piVar3;
  int iVar4;
  DdNode *bTemp;
  DdNode *pDVar5;
  DdNode *pDVar6;
  long lVar7;
  void *__ptr;
  undefined8 *puVar8;
  DdNode **F;
  ulong uVar9;
  DdNode *pDVar10;
  void *__ptr_00;
  DdHalfWord *pDVar11;
  void *__ptr_01;
  ulong uVar12;
  long lVar13;
  Bbr_ImageNode_t *pBVar14;
  Bbr_ImageTree_t *pBVar15;
  Bbr_ImageNode_t *pBVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  ulong uVar22;
  Bbr_ImageNode_t *pNode2;
  DdNode *f;
  DdHalfWord DVar23;
  uint uVar24;
  long lVar25;
  double dVar26;
  double dVar27;
  
  uVar12 = (ulong)(uint)nParts;
  if ((fVerbose != 0) && (dd->size < 0x51)) {
    pDVar5 = Cudd_Support(dd,bCare);
    Cudd_Ref(pDVar5);
    pDVar6 = Cudd_bddComputeCube(dd,pbVars,(int *)0x0,nVars);
    Cudd_Ref(pDVar6);
    puts("The latch dependency matrix:");
    printf("Partitions = %d   Variables: total = %d  non-quantifiable = %d\n",uVar12,
           (ulong)(uint)dd->size,(ulong)(uint)nVars);
    printf("     : ");
    if (0 < dd->size) {
      uVar24 = 0;
      do {
        printf("%d",(ulong)(uVar24 % 10));
        uVar24 = uVar24 + 1;
      } while ((int)uVar24 < dd->size);
    }
    putchar(10);
    if (0 < nParts) {
      uVar22 = 0;
      do {
        Bbr_bddImagePrintLatchDependencyOne(dd,pbParts[uVar22],pDVar5,pDVar6,(int)uVar22);
        uVar22 = uVar22 + 1;
      } while (uVar12 != uVar22);
    }
    Bbr_bddImagePrintLatchDependencyOne(dd,bCare,pDVar5,pDVar6,nParts);
    Cudd_RecursiveDeref(dd,pDVar5);
    Cudd_RecursiveDeref(dd,pDVar6);
  }
  lVar7 = (long)nParts;
  __size = lVar7 * 8 + 8;
  __ptr = malloc(__size);
  if (0 < nParts) {
    uVar22 = 0;
    do {
      puVar8 = (undefined8 *)malloc(0x18);
      *(undefined8 **)((long)__ptr + uVar22 * 8) = puVar8;
      pDVar5 = pbParts[uVar22];
      *puVar8 = pDVar5;
      Cudd_Ref(pDVar5);
      pDVar5 = Cudd_Support(dd,(DdNode *)*puVar8);
      puVar8[1] = pDVar5;
      Cudd_Ref(pDVar5);
      iVar4 = Cudd_SupportSize(dd,(DdNode *)puVar8[1]);
      *(short *)((long)puVar8 + 0x14) = (short)iVar4;
      iVar4 = Cudd_DagSize((DdNode *)*puVar8);
      *(int *)(puVar8 + 2) = iVar4;
      *(short *)((long)puVar8 + 0x16) = (short)uVar22;
      uVar22 = uVar22 + 1;
    } while (uVar12 != uVar22);
  }
  puVar8 = (undefined8 *)malloc(0x18);
  *(undefined8 **)((long)__ptr + lVar7 * 8) = puVar8;
  *puVar8 = bCare;
  Cudd_Ref(bCare);
  pDVar5 = Cudd_Support(dd,(DdNode *)*puVar8);
  puVar8[1] = pDVar5;
  Cudd_Ref(pDVar5);
  iVar4 = Cudd_SupportSize(dd,(DdNode *)puVar8[1]);
  *(short *)((long)puVar8 + 0x14) = (short)iVar4;
  iVar4 = Cudd_DagSize((DdNode *)*puVar8);
  *(int *)(puVar8 + 2) = iVar4;
  *(short *)((long)puVar8 + 0x16) = (short)nParts;
  F = (DdNode **)malloc(__size);
  uVar22 = (ulong)(nParts + 1U);
  if (-1 < nParts) {
    uVar9 = 0;
    do {
      F[uVar9] = *(DdNode **)(*(long *)((long)__ptr + uVar9 * 8) + 8);
      uVar9 = uVar9 + 1;
    } while (uVar22 != uVar9);
  }
  pDVar5 = Cudd_VectorSupport(dd,F,nParts + 1U);
  Cudd_Ref(pDVar5);
  if (F != (DdNode **)0x0) {
    free(F);
  }
  pDVar6 = Cudd_bddComputeCube(dd,pbVars,(int *)0x0,nVars);
  Cudd_Ref(pDVar6);
  pDVar10 = Cudd_bddExistAbstract(dd,pDVar5,pDVar6);
  Cudd_Ref(pDVar10);
  Cudd_RecursiveDeref(dd,pDVar5);
  Cudd_RecursiveDeref(dd,pDVar6);
  Cudd_SupportSize(dd,pDVar10);
  __ptr_00 = calloc(1,(long)dd->size << 3);
  pDVar6 = dd->one;
  pDVar5 = pDVar10;
  if (pDVar10 != pDVar6) {
    do {
      DVar1 = pDVar5->index;
      pDVar11 = (DdHalfWord *)malloc(0x18);
      *(DdHalfWord **)((long)__ptr_00 + (long)(int)DVar1 * 8) = pDVar11;
      *pDVar11 = DVar1;
      Cudd_Ref(pDVar6);
      if (nParts < 0) {
        DVar23 = 0;
      }
      else {
        uVar9 = 0;
        DVar23 = 0;
        f = pDVar6;
        do {
          iVar4 = Cudd_bddLeq(dd,*(DdNode **)(*(long *)((long)__ptr + uVar9 * 8) + 8),
                              dd->vars[pDVar5->index]);
          pDVar6 = f;
          if (iVar4 != 0) {
            pDVar6 = Cudd_bddAnd(dd,f,dd->vars[uVar9]);
            Cudd_Ref(pDVar6);
            Cudd_RecursiveDeref(dd,f);
            DVar23 = DVar23 + 1;
          }
          uVar9 = uVar9 + 1;
          f = pDVar6;
        } while (uVar22 != uVar9);
        pDVar11 = *(DdHalfWord **)((long)__ptr_00 + (long)(int)DVar1 * 8);
      }
      *(DdNode **)(pDVar11 + 2) = pDVar6;
      pDVar11[4] = DVar23;
      pDVar5 = (pDVar5->type).kids.T;
      pDVar6 = dd->one;
    } while (pDVar5 != pDVar6);
  }
  Cudd_RecursiveDeref(dd,pDVar10);
  uVar24 = dd->size;
  __ptr_01 = malloc(__size);
  if (-1 < nParts) {
    uVar9 = 0;
    do {
      puVar8 = (undefined8 *)calloc(1,0x30);
      *(undefined8 **)((long)__ptr_01 + uVar9 * 8) = puVar8;
      *puVar8 = dd;
      puVar8[5] = *(undefined8 *)((long)__ptr + uVar9 * 8);
      uVar9 = uVar9 + 1;
    } while (uVar22 != uVar9);
  }
  if (0 < (int)uVar24) {
    uVar9 = 0;
    do {
      pvVar2 = *(void **)((long)__ptr_00 + uVar9 * 8);
      if (pvVar2 != (void *)0x0) {
        if (*(int *)((long)pvVar2 + 0x10) < 1) {
          __assert_fail("pVars[v]->nParts > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                        ,0x21a,
                        "Bbr_ImageNode_t **Bbr_CreateNodes(DdManager *, int, Bbr_ImagePart_t **, int, Bbr_ImageVar_t **)"
                       );
        }
        if (*(int *)((long)pvVar2 + 0x10) == 1) {
          lVar13 = *(long *)((long)__ptr_01 + (long)**(int **)((long)pvVar2 + 8) * 8);
          pDVar5 = *(DdNode **)(lVar13 + 8);
          pDVar6 = dd->vars[uVar9];
          if (pDVar5 == (DdNode *)0x0) {
            *(DdNode **)(lVar13 + 8) = pDVar6;
            Cudd_Ref(pDVar6);
          }
          else {
            pDVar6 = Cudd_bddAnd(dd,pDVar5,pDVar6);
            *(DdNode **)(lVar13 + 8) = pDVar6;
            Cudd_Ref(pDVar6);
            Cudd_RecursiveDeref(dd,pDVar5);
          }
          Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar2 + 8));
          free(pvVar2);
          *(undefined8 *)((long)__ptr_00 + uVar9 * 8) = 0;
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar24 != uVar9);
  }
  if (-1 < nParts) {
    uVar9 = 0;
    do {
      lVar13 = *(long *)((long)__ptr_01 + uVar9 * 8);
      puVar8 = *(undefined8 **)((long)__ptr + uVar9 * 8);
      if (*(DdNode **)(lVar13 + 8) != (DdNode *)0x0) {
        pDVar5 = (DdNode *)*puVar8;
        pDVar6 = Cudd_bddExistAbstract(dd,pDVar5,*(DdNode **)(lVar13 + 8));
        *puVar8 = pDVar6;
        Cudd_Ref(pDVar6);
        Cudd_RecursiveDeref(dd,pDVar5);
        pDVar5 = (DdNode *)puVar8[1];
        pDVar6 = Cudd_bddExistAbstract(dd,pDVar5,*(DdNode **)(lVar13 + 8));
        puVar8[1] = pDVar6;
        Cudd_Ref(pDVar6);
        Cudd_RecursiveDeref(dd,pDVar5);
        iVar4 = Cudd_SupportSize(dd,(DdNode *)puVar8[1]);
        *(short *)((long)puVar8 + 0x14) = (short)iVar4;
        iVar4 = Cudd_DagSize((DdNode *)*puVar8);
        *(int *)(puVar8 + 2) = iVar4;
        if (uVar9 < uVar12) {
          Cudd_RecursiveDeref(dd,*(DdNode **)(lVar13 + 8));
          *(undefined8 *)(lVar13 + 8) = 0;
        }
      }
      pDVar5 = (DdNode *)*puVar8;
      *(DdNode **)(lVar13 + 0x10) = pDVar5;
      Cudd_Ref(pDVar5);
      uVar9 = uVar9 + 1;
    } while (uVar22 != uVar9);
  }
  pBVar16 = *(Bbr_ImageNode_t **)((long)__ptr_01 + lVar7 * 8);
  uVar24 = dd->size;
  if (0 < (int)uVar24) {
LAB_007cbfa6:
    uVar17 = (ulong)uVar24;
    uVar9 = 0xffffffff;
    uVar12 = 0;
    dVar26 = 100000000000000.0;
    do {
      lVar7 = *(long *)((long)__ptr_00 + uVar12 * 8);
      if ((lVar7 != 0) && (*(int *)(lVar7 + 0x10) == 2)) {
        dVar27 = 0.0;
        for (pDVar5 = *(DdNode **)(lVar7 + 8); pDVar5 != dd->one; pDVar5 = (pDVar5->type).kids.T) {
          iVar4 = *(int *)(*(long *)(*(long *)((long)__ptr_01 + (ulong)pDVar5->index * 8) + 0x28) +
                          0x10);
          dVar27 = dVar27 + (double)(iVar4 * iVar4);
        }
        if (dVar27 < dVar26) {
          uVar9 = uVar12 & 0xffffffff;
          dVar26 = dVar27;
        }
      }
      uVar24 = (uint)uVar9;
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar17);
    if (-1 < (int)uVar24) {
LAB_007cc07c:
      lVar7 = (long)(int)uVar24;
      piVar3 = *(int **)((long)__ptr_00 + lVar7 * 8);
      iVar4 = Cudd_SupportSize(dd,*(DdNode **)(piVar3 + 2));
      if (iVar4 != piVar3[4]) {
        __assert_fail("nSupp == pVar->nParts",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                      ,0x2f1,
                      "int Bbr_BuildTreeNode(DdManager *, int, Bbr_ImageNode_t **, int, Bbr_ImageVar_t **, int *, int)"
                     );
      }
      if (iVar4 == 2) {
        lVar25 = (long)**(int **)(piVar3 + 2);
        lVar13 = (long)**(int **)(*(int **)(piVar3 + 2) + 4);
        pBVar14 = *(Bbr_ImageNode_t **)((long)__ptr_01 + lVar25 * 8);
        pNode2 = *(Bbr_ImageNode_t **)((long)__ptr_01 + lVar13 * 8);
        pDVar5 = dd->vars[*piVar3];
        Cudd_Ref(pDVar5);
        uVar12 = 0;
        do {
          pDVar6 = pDVar5;
          if (((uVar24 != uVar12) &&
              (piVar3 = *(int **)((long)__ptr_00 + uVar12 * 8), piVar3 != (int *)0x0)) &&
             (*(long *)(piVar3 + 2) == *(long *)(*(long *)((long)__ptr_00 + lVar7 * 8) + 8))) {
            pDVar6 = Cudd_bddAnd(dd,pDVar5,dd->vars[*piVar3]);
            Cudd_Ref(pDVar6);
            Cudd_RecursiveDeref(dd,pDVar5);
            pvVar2 = *(void **)((long)__ptr_00 + uVar12 * 8);
            Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar2 + 8));
            free(pvVar2);
            *(undefined8 *)((long)__ptr_00 + uVar12 * 8) = 0;
          }
          uVar12 = uVar12 + 1;
          pDVar5 = pDVar6;
        } while (uVar17 != uVar12);
        pvVar2 = *(void **)((long)__ptr_00 + lVar7 * 8);
        Cudd_RecursiveDeref(dd,*(DdNode **)((long)pvVar2 + 8));
        free(pvVar2);
        *(undefined8 *)((long)__ptr_00 + lVar7 * 8) = 0;
        pBVar14 = Bbr_CombineTwoNodes(dd,pDVar6,pBVar14,pNode2);
        Cudd_RecursiveDeref(dd,pDVar6);
      }
      else {
        if (iVar4 == 1) {
          __assert_fail("nSupp != 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                        ,0x2f2,
                        "int Bbr_BuildTreeNode(DdManager *, int, Bbr_ImageNode_t **, int, Bbr_ImageVar_t **, int *, int)"
                       );
        }
        pDVar5 = *(DdNode **)(piVar3 + 2);
        pDVar6 = dd->one;
        if (pDVar6 == pDVar5) {
          lVar25 = -1;
          lVar13 = -1;
        }
        else {
          uVar12 = 0xffffffff;
          uVar9 = 0xffffffff;
          iVar4 = 1000000;
          iVar20 = 1000000;
          do {
            uVar24 = pDVar5->index;
            uVar19 = (ulong)uVar24;
            iVar21 = *(int *)(*(long *)(*(long *)((long)__ptr_01 + uVar19 * 8) + 0x28) + 0x10);
            uVar17 = uVar9;
            iVar18 = iVar4;
            if (iVar4 <= iVar21) {
              if (iVar21 < iVar20) {
                uVar12 = uVar19;
              }
              iVar18 = iVar21;
              if (iVar20 < iVar21) {
                iVar18 = iVar20;
              }
              uVar24 = (uint)uVar9;
              uVar17 = uVar12;
              uVar19 = uVar9;
              iVar21 = iVar4;
            }
            pDVar5 = (pDVar5->type).kids.T;
            uVar12 = uVar17;
            uVar9 = uVar19;
            iVar4 = iVar21;
            iVar20 = iVar18;
          } while (pDVar5 != pDVar6);
          lVar25 = (long)(int)uVar24;
          lVar13 = (long)(int)uVar17;
        }
        pNode2 = *(Bbr_ImageNode_t **)((long)__ptr_01 + lVar13 * 8);
        pBVar14 = Bbr_CombineTwoNodes(dd,pDVar6,*(Bbr_ImageNode_t **)((long)__ptr_01 + lVar25 * 8),
                                      pNode2);
      }
      *(Bbr_ImageNode_t **)((long)__ptr_01 + lVar25 * 8) = pBVar14;
      *(undefined8 *)((long)__ptr_01 + lVar13 * 8) = 0;
      pDVar5 = pNode2->pPart->bSupp;
      pDVar6 = dd->one;
      if (pDVar5 != pDVar6) {
        do {
          lVar7 = *(long *)((long)__ptr_00 + (ulong)pDVar5->index * 8);
          if (lVar7 != 0) {
            iVar4 = Cudd_bddLeq(dd,*(DdNode **)(lVar7 + 8),dd->vars[lVar13]);
            if (iVar4 == 0) {
              __assert_fail("Cudd_bddLeq( dd, pVar->bParts, dd->vars[iNode2] )",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                            ,0x333,
                            "int Bbr_BuildTreeNode(DdManager *, int, Bbr_ImageNode_t **, int, Bbr_ImageVar_t **, int *, int)"
                           );
            }
            pDVar6 = *(DdNode **)(lVar7 + 8);
            pDVar10 = Cudd_bddExistAbstract(dd,pDVar6,dd->vars[lVar13]);
            *(DdNode **)(lVar7 + 8) = pDVar10;
            Cudd_Ref(pDVar10);
            Cudd_RecursiveDeref(dd,pDVar6);
            pDVar6 = *(DdNode **)(lVar7 + 8);
            pDVar10 = Cudd_bddAnd(dd,pDVar6,dd->vars[lVar25]);
            *(DdNode **)(lVar7 + 8) = pDVar10;
            Cudd_Ref(pDVar10);
            Cudd_RecursiveDeref(dd,pDVar6);
            iVar4 = Cudd_SupportSize(dd,*(DdNode **)(lVar7 + 8));
            *(int *)(lVar7 + 0x10) = iVar4;
            pDVar6 = dd->one;
          }
          pDVar5 = (pDVar5->type).kids.T;
        } while (pDVar5 != pDVar6);
      }
      uVar24 = dd->size;
      if (dd->keys - dd->dead <= (uint)nBddMax) goto code_r0x007cc39d;
      if ((int)uVar24 < 1) {
        if (__ptr_00 == (void *)0x0) goto LAB_007cc542;
      }
      else {
        lVar7 = 0;
        do {
          pvVar2 = *(void **)((long)__ptr_00 + lVar7 * 8);
          if (pvVar2 != (void *)0x0) {
            free(pvVar2);
            *(undefined8 *)((long)__ptr_00 + lVar7 * 8) = 0;
            uVar24 = dd->size;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < (int)uVar24);
      }
      free(__ptr_00);
LAB_007cc542:
      if (nParts < 0) {
        if (__ptr_01 != (void *)0x0) goto LAB_007cc573;
      }
      else {
        uVar12 = 0;
        do {
          pBVar16 = *(Bbr_ImageNode_t **)((long)__ptr_01 + uVar12 * 8);
          if (pBVar16 != (Bbr_ImageNode_t *)0x0) {
            Bbr_DeleteParts_rec(pBVar16);
            Bbr_bddImageTreeDelete_rec(pBVar16);
          }
          uVar12 = uVar12 + 1;
        } while (uVar22 != uVar12);
LAB_007cc573:
        free(__ptr_01);
      }
      pBVar15 = (Bbr_ImageTree_t *)0x0;
      goto LAB_007cc57e;
    }
    uVar12 = 0;
    do {
      lVar7 = *(long *)((long)__ptr_00 + uVar12 * 8);
      if (lVar7 != 0) {
        if (*(int *)(lVar7 + 0x10) < 2) {
          __assert_fail("pVars[v]->nParts > 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                        ,0x3d9,
                        "int Bbr_FindBestVariable(DdManager *, int, Bbr_ImageNode_t **, int, Bbr_ImageVar_t **)"
                       );
        }
        dVar27 = 0.0;
        for (pDVar5 = *(DdNode **)(lVar7 + 8); pDVar5 != dd->one; pDVar5 = (pDVar5->type).kids.T) {
          iVar4 = *(int *)(*(long *)(*(long *)((long)__ptr_01 + (ulong)pDVar5->index * 8) + 0x28) +
                          0x10);
          dVar27 = dVar27 + (double)(iVar4 * iVar4);
        }
        if (dVar27 < dVar26) {
          uVar9 = uVar12 & 0xffffffff;
          dVar26 = dVar27;
        }
      }
      uVar24 = (uint)uVar9;
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar17);
    if (uVar24 != 0xffffffff) goto LAB_007cc07c;
    if (0 < (long)dd->size) {
      lVar7 = 0;
      do {
        if (*(long *)((long)__ptr_00 + lVar7 * 8) != 0) {
          __assert_fail("pVars[v] == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                        ,0xd3,
                        "Bbr_ImageTree_t *Bbr_bddImageStart(DdManager *, DdNode *, int, DdNode **, int, DdNode **, int, int)"
                       );
        }
        lVar7 = lVar7 + 1;
      } while (dd->size != lVar7);
      goto LAB_007cc3b4;
    }
  }
LAB_007cc3aa:
  if (__ptr_00 != (void *)0x0) {
LAB_007cc3b4:
    free(__ptr_00);
  }
  pBVar15 = (Bbr_ImageTree_t *)calloc(1,0x30);
  pBVar15->pCare = pBVar16;
  pBVar15->nBddMax = nBddMax;
  pBVar15->fVerbose = fVerbose;
  if (nParts < 0) {
LAB_007cc619:
    __assert_fail("n1 != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                  ,0x364,"Bbr_ImageNode_t *Bbr_MergeTopNodes(DdManager *, int, Bbr_ImageNode_t **)")
    ;
  }
  iVar4 = -1;
  uVar12 = 0;
LAB_007cc3fd:
  do {
    iVar20 = iVar4;
    if ((*(long *)((long)__ptr_01 + uVar12 * 8) == 0) || (iVar20 = (int)uVar12, iVar4 == -1)) {
      iVar4 = iVar20;
      uVar12 = uVar12 + 1;
      if (uVar12 != uVar22) goto LAB_007cc3fd;
      if (iVar4 == -1) goto LAB_007cc619;
      uVar12 = (ulong)iVar4;
      pBVar16 = *(Bbr_ImageNode_t **)((long)__ptr_01 + uVar12 * 8);
    }
    else {
      uVar12 = uVar12 & 0xffffffff;
      pBVar16 = Bbr_CombineTwoNodes(dd,dd->one,
                                    *(Bbr_ImageNode_t **)((long)__ptr_01 + (long)iVar4 * 8),
                                    *(Bbr_ImageNode_t **)((long)__ptr_01 + uVar12 * 8));
      *(Bbr_ImageNode_t **)((long)__ptr_01 + (long)iVar4 * 8) = pBVar16;
      pBVar16 = (Bbr_ImageNode_t *)0x0;
    }
    *(undefined8 *)(uVar12 * 8 + (long)__ptr_01) = 0;
    pBVar15->pRoot = pBVar16;
    uVar12 = 0;
    iVar4 = -1;
    if (pBVar16 != (Bbr_ImageNode_t *)0x0) {
      uVar12 = 0;
      do {
        if (*(long *)((long)__ptr_01 + uVar12 * 8) != 0) {
          __assert_fail("pNodes[v] == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/bbr/bbrImage.c"
                        ,0xe2,
                        "Bbr_ImageTree_t *Bbr_bddImageStart(DdManager *, DdNode *, int, DdNode **, int, DdNode **, int, int)"
                       );
        }
        uVar12 = uVar12 + 1;
      } while (uVar22 != uVar12);
      free(__ptr_01);
      pDVar5 = Cudd_Support(dd,bCare);
      pBVar15->bCareSupp = pDVar5;
      Cudd_Ref(pDVar5);
      Bbr_DeleteParts_rec(pBVar16);
LAB_007cc57e:
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      return pBVar15;
    }
  } while( true );
code_r0x007cc39d:
  if ((int)uVar24 < 1) goto LAB_007cc3aa;
  goto LAB_007cbfa6;
}

Assistant:

Bbr_ImageTree_t * Bbr_bddImageStart( 
    DdManager * dd, DdNode * bCare, // the care set
    int nParts, DdNode ** pbParts,  // the partitions for image computation
    int nVars, DdNode ** pbVars, int nBddMax, int fVerbose )   // the NS and parameter variables (not quantified!)
{
    Bbr_ImageTree_t * pTree;
    Bbr_ImagePart_t ** pParts;
    Bbr_ImageVar_t ** pVars;
    Bbr_ImageNode_t ** pNodes, * pCare;
    int fStop, v;

    if ( fVerbose && dd->size <= 80 )
        Bbr_bddImagePrintLatchDependency( dd, bCare, nParts, pbParts, nVars, pbVars );

    // create variables, partitions and leaf nodes
    pParts = Bbr_CreateParts( dd, nParts, pbParts, bCare );
    pVars  = Bbr_CreateVars( dd, nParts + 1, pParts, nVars, pbVars );
    pNodes = Bbr_CreateNodes( dd, nParts + 1, pParts, dd->size, pVars );
    pCare  = pNodes[nParts];

    // process the nodes
    while ( Bbr_BuildTreeNode( dd, nParts + 1, pNodes, dd->size, pVars, &fStop, nBddMax ) );

    // consider the case of BDD node blowup
    if ( fStop )
    {
        for ( v = 0; v < dd->size; v++ )
            if ( pVars[v] )
                ABC_FREE( pVars[v] );
        ABC_FREE( pVars );
        for ( v = 0; v <= nParts; v++ )
            if ( pNodes[v] )
            {
                Bbr_DeleteParts_rec( pNodes[v] );
                Bbr_bddImageTreeDelete_rec( pNodes[v] );
            }
        ABC_FREE( pNodes );
        ABC_FREE( pParts );
        return NULL;
    }

    // make sure the variables are gone
    for ( v = 0; v < dd->size; v++ )
        assert( pVars[v] == NULL );
    ABC_FREE( pVars );
    
    // create the tree
    pTree = ABC_ALLOC( Bbr_ImageTree_t, 1 );
    memset( pTree, 0, sizeof(Bbr_ImageTree_t) );
    pTree->pCare = pCare;
    pTree->nBddMax = nBddMax;
    pTree->fVerbose = fVerbose;

    // merge the topmost nodes
    while ( (pTree->pRoot = Bbr_MergeTopNodes( dd, nParts + 1, pNodes )) == NULL );

    // make sure the nodes are gone
    for ( v = 0; v < nParts + 1; v++ )
        assert( pNodes[v] == NULL );
    ABC_FREE( pNodes );

//    if ( fVerbose )
//        Bbr_bddImagePrintTree( pTree );

    // set the support of the care set
    pTree->bCareSupp = Cudd_Support( dd, bCare );  Cudd_Ref( pTree->bCareSupp );

    // clean the partitions
    Bbr_DeleteParts_rec( pTree->pRoot );
    ABC_FREE( pParts );

    return pTree;
}